

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membervariable.cpp
# Opt level: O2

void __thiscall
cppgenerate::MemberVariable::print
          (MemberVariable *this,ostream *stream,int indent,bool withAccessModifier)

{
  string *__rhs;
  AccessModifier AVar1;
  CodeBlock *pCVar2;
  string *psVar3;
  CodeBlock block;
  allocator local_392;
  allocator local_391;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  string local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  string local_2d0;
  string local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  CodeBlock local_1b0;
  
  CodeBlock::CodeBlock(&local_1b0);
  if (((this->super_Variable).m_name._M_string_length == 0) ||
     ((this->super_Variable).m_type._M_string_length == 0)) goto LAB_00113bd9;
  if (withAccessModifier) {
    AVar1 = this->m_access;
    if (AVar1 == PROTECTED) {
      std::__cxx11::string::string((string *)&local_210,"protected:",(allocator *)&local_390);
      CodeBlock::addLine(&local_1b0,&local_210);
      psVar3 = &local_210;
    }
    else if (AVar1 == PRIVATE) {
      std::__cxx11::string::string((string *)&local_1f0,"private:",(allocator *)&local_390);
      CodeBlock::addLine(&local_1b0,&local_1f0);
      psVar3 = &local_1f0;
    }
    else {
      if (AVar1 != PUBLIC) goto LAB_00113890;
      std::__cxx11::string::string((string *)&local_1d0,"public:",(allocator *)&local_390);
      CodeBlock::addLine(&local_1b0,&local_1d0);
      psVar3 = &local_1d0;
    }
    std::__cxx11::string::~string((string *)psVar3);
  }
LAB_00113890:
  pCVar2 = CodeBlock::indent(&local_1b0);
  psVar3 = &(this->super_Variable).m_type;
  std::operator+(&local_370,psVar3," ");
  __rhs = &(this->super_Variable).m_name;
  std::operator+(&local_390,&local_370,__rhs);
  std::operator+(&local_230,&local_390,";");
  pCVar2 = CodeBlock::addLine(pCVar2,&local_230);
  CodeBlock::unindent(pCVar2);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_370);
  if (this->m_generateSetter == true) {
    std::__cxx11::string::string((string *)&local_250,"public:",&local_391);
    pCVar2 = CodeBlock::addLine(&local_1b0,&local_250);
    std::operator+(&local_350,"void set",__rhs);
    std::operator+(&local_370,&local_350,"( ");
    std::operator+(&local_390,&local_370,psVar3);
    std::operator+(&local_270,&local_390," arg ){");
    pCVar2 = CodeBlock::addLine(pCVar2,&local_270);
    pCVar2 = CodeBlock::indent(pCVar2);
    std::operator+(&local_290,__rhs," = arg;");
    pCVar2 = CodeBlock::addLine(pCVar2,&local_290);
    pCVar2 = CodeBlock::unindent(pCVar2);
    std::__cxx11::string::string((string *)&local_2b0,"}",&local_392);
    CodeBlock::addLine(pCVar2,&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_250);
  }
  if (this->m_generateGetter == true) {
    std::__cxx11::string::string((string *)&local_2d0,"public:",&local_391);
    pCVar2 = CodeBlock::addLine(&local_1b0,&local_2d0);
    std::operator+(&local_370,psVar3," get");
    std::operator+(&local_390,&local_370,__rhs);
    std::operator+(&local_2f0,&local_390,"(){");
    pCVar2 = CodeBlock::addLine(pCVar2,&local_2f0);
    pCVar2 = CodeBlock::indent(pCVar2);
    std::operator+(&local_350,"return ",__rhs);
    std::operator+(&local_310,&local_350,";");
    pCVar2 = CodeBlock::addLine(pCVar2,&local_310);
    pCVar2 = CodeBlock::unindent(pCVar2);
    std::__cxx11::string::string((string *)&local_330,"}",&local_392);
    CodeBlock::addLine(pCVar2,&local_330);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_2d0);
  }
  CodeBlock::print(&local_1b0,stream);
LAB_00113bd9:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
  return;
}

Assistant:

void MemberVariable::print( std::ostream& stream, int indent, bool withAccessModifier ) const {
    cppgenerate::CodeBlock block;

    if( m_name.size() == 0 || m_type.size() == 0 ){
        //Can't generate code for this memvar
        return;
    }

    if( withAccessModifier ){
        switch( m_access ){
            case AccessModifier::PUBLIC:
                block.addLine( "public:");
                break;
            case AccessModifier::PRIVATE:
                block.addLine( "private:");
                break;
            case AccessModifier::PROTECTED:
                block.addLine( "protected:");
                break;
        }
    }

    block.indent()
        .addLine( m_type + " " + m_name + ";" )
        .unindent();

    if( m_generateSetter ){
        block.addLine( "public:" )
            .addLine( "void set" + m_name + "( " + m_type + " arg ){" )
            .indent()
            .addLine( m_name + " = arg;" )
            .unindent()
            .addLine( "}" );
    }

    if( m_generateGetter ){
        block.addLine( "public:" )
            .addLine( m_type + " get" + m_name + "(){" )
            .indent()
            .addLine( "return " + m_name + ";" )
            .unindent()
            .addLine( "}" );
    }

    block.print( stream );
}